

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

iterator __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::erase
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,const_iterator pos)

{
  size_type sVar1;
  const_iterator this_00;
  long lVar2;
  
  lVar2 = (long)((long)this->data_ + (this->len * 8 - (long)pos) + -8) >> 3;
  if (0 < lVar2) {
    lVar2 = lVar2 + 1;
    this_00 = pos;
    do {
      anon_unknown.dwarf_d92100::Constructable::operator=(this_00,this_00 + 1);
      lVar2 = lVar2 + -1;
      this_00 = this_00 + 1;
    } while (1 < lVar2);
  }
  sVar1 = this->len;
  this->len = sVar1 - 1;
  anon_unknown.dwarf_d92100::Constructable::~Constructable(this->data_ + (sVar1 - 1));
  return pos;
}

Assistant:

iterator erase(const_iterator pos) {
        // const_cast is fine, this is a non-const member function.
        iterator result = const_cast<iterator>(pos);

        std::ranges::move(result + 1, end(), result);
        pop_back();
        return result;
    }